

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_flush(ikcpcb *kcp)

{
  IUINT32 IVar1;
  IUINT32 IVar2;
  char *data;
  IQUEUEHEAD *pIVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  IUINT32 local_100;
  uint local_fc;
  int local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  IUINT32 inflight;
  int need;
  IINT32 step;
  int needsend;
  IKCPSEG *segment;
  IKCPSEG *newseg;
  IKCPSEG seg;
  int lost;
  int change;
  IQUEUEHEAD *p;
  IUINT32 rtomin;
  IUINT32 cwnd;
  IUINT32 resent;
  int i;
  int size;
  int count;
  char *ptr;
  char *buffer;
  IUINT32 current;
  ikcpcb *kcp_local;
  
  IVar1 = kcp->current;
  data = kcp->buffer;
  seg._68_4_ = 0;
  seg.data[0] = '\0';
  seg._65_3_ = 0;
  if (kcp->updated != 0) {
    seg.node.prev._0_4_ = kcp->conv;
    seg.node.prev._4_4_ = 0x52;
    seg.conv = 0;
    seg.cmd = ikcp_wnd_unused(kcp);
    seg.ts = kcp->rcv_nxt;
    seg.sn = 0;
    seg.wnd = 0;
    seg.frg = 0;
    IVar2 = kcp->ackcount;
    cwnd = 0;
    _size = data;
    while( true ) {
      iVar5 = (int)data;
      if ((int)IVar2 <= (int)cwnd) break;
      iVar5 = (int)_size - iVar5;
      if ((int)kcp->mtu < iVar5 + 0x18) {
        ikcp_output(kcp,data,iVar5);
        _size = data;
      }
      ikcp_ack_get(kcp,cwnd,&seg.wnd,&seg.frg);
      _size = ikcp_encode_seg(_size,(IKCPSEG *)&newseg);
      cwnd = cwnd + 1;
    }
    kcp->ackcount = 0;
    if (kcp->rmt_wnd == 0) {
      if (kcp->probe_wait == 0) {
        kcp->probe_wait = 7000;
        kcp->ts_probe = kcp->current + kcp->probe_wait;
      }
      else if (-1 < (int)(kcp->current - kcp->ts_probe)) {
        if (kcp->probe_wait < 7000) {
          kcp->probe_wait = 7000;
        }
        kcp->probe_wait = (kcp->probe_wait >> 1) + kcp->probe_wait;
        if (120000 < kcp->probe_wait) {
          kcp->probe_wait = 120000;
        }
        kcp->ts_probe = kcp->current + kcp->probe_wait;
        kcp->probe = kcp->probe | 1;
      }
    }
    else {
      kcp->ts_probe = 0;
      kcp->probe_wait = 0;
    }
    if ((kcp->probe & 1) != 0) {
      seg.node.prev._4_4_ = 0x53;
      iVar6 = (int)_size - iVar5;
      if ((int)kcp->mtu < iVar6 + 0x18) {
        ikcp_output(kcp,data,iVar6);
        _size = data;
      }
      _size = ikcp_encode_seg(_size,(IKCPSEG *)&newseg);
    }
    if ((kcp->probe & 2) != 0) {
      seg.node.prev._4_4_ = 0x54;
      iVar6 = (int)_size - iVar5;
      if ((int)kcp->mtu < iVar6 + 0x18) {
        ikcp_output(kcp,data,iVar6);
        _size = data;
      }
      _size = ikcp_encode_seg(_size,(IKCPSEG *)&newseg);
    }
    kcp->probe = 0;
    local_ec = kcp->rmt_wnd;
    if (kcp->snd_wnd <= local_ec) {
      local_ec = kcp->snd_wnd;
    }
    p._4_4_ = local_ec;
    if (kcp->nocwnd == 0) {
      local_f0 = kcp->cwnd;
      if (local_ec < local_f0) {
        local_f0 = local_ec;
      }
      p._4_4_ = local_f0;
    }
    while (((int)(kcp->snd_nxt - (kcp->snd_una + p._4_4_)) < 0 &&
           (&kcp->snd_queue != (kcp->snd_queue).next))) {
      pIVar3 = (kcp->snd_queue).next;
      pIVar3->next->prev = pIVar3->prev;
      pIVar3->prev->next = pIVar3->next;
      pIVar3->next = (IQUEUEHEAD *)0x0;
      pIVar3->prev = (IQUEUEHEAD *)0x0;
      pIVar3->prev = (kcp->snd_buf).prev;
      pIVar3->next = &kcp->snd_buf;
      ((kcp->snd_buf).prev)->next = pIVar3;
      (kcp->snd_buf).prev = pIVar3;
      kcp->nsnd_que = kcp->nsnd_que - 1;
      kcp->nsnd_buf = kcp->nsnd_buf + 1;
      *(IUINT32 *)&pIVar3[1].next = kcp->conv;
      *(undefined4 *)((long)&pIVar3[1].next + 4) = 0x51;
      *(IUINT32 *)((long)&pIVar3[1].prev + 4) = seg.cmd;
      *(IUINT32 *)&pIVar3[2].next = IVar1;
      IVar2 = kcp->snd_nxt;
      kcp->snd_nxt = IVar2 + 1;
      *(IUINT32 *)((long)&pIVar3[2].next + 4) = IVar2;
      *(IUINT32 *)&pIVar3[2].prev = kcp->rcv_nxt;
      *(IUINT32 *)&pIVar3[3].next = IVar1;
      *(IINT32 *)((long)&pIVar3[3].next + 4) = kcp->rx_rto;
      *(undefined4 *)&pIVar3[3].prev = 0;
      *(undefined4 *)((long)&pIVar3[3].prev + 4) = 0;
    }
    if (kcp->fastresend < 1) {
      local_f4 = 0xffffffff;
    }
    else {
      local_f4 = kcp->fastresend;
    }
    if (kcp->nodelay == 0) {
      local_f8 = kcp->rx_rto >> 3;
    }
    else {
      local_f8 = 0;
    }
    for (_lost = (IKCPSEG *)(kcp->snd_buf).next; _lost != (IKCPSEG *)&kcp->snd_buf;
        _lost = (IKCPSEG *)(_lost->node).next) {
      bVar4 = false;
      if (_lost->xmit == 0) {
        bVar4 = true;
        _lost->xmit = _lost->xmit + 1;
        _lost->rto = kcp->rx_rto;
        _lost->resendts = IVar1 + _lost->rto + local_f8;
      }
      else if ((int)(IVar1 - _lost->resendts) < 0) {
        if ((local_f4 <= _lost->fastack) &&
           (((int)_lost->xmit <= kcp->fastlimit || (kcp->fastlimit < 1)))) {
          bVar4 = true;
          _lost->xmit = _lost->xmit + 1;
          _lost->fastack = 0;
          _lost->resendts = IVar1 + _lost->rto;
          seg._68_4_ = seg._68_4_ + 1;
        }
      }
      else {
        bVar4 = true;
        _lost->xmit = _lost->xmit + 1;
        kcp->xmit = kcp->xmit + 1;
        if (kcp->nodelay == 0) {
          local_fc = kcp->rx_rto;
          if (local_fc <= _lost->rto) {
            local_fc = _lost->rto;
          }
          _lost->rto = local_fc + _lost->rto;
        }
        else {
          if (kcp->nodelay < 2) {
            local_100 = _lost->rto;
          }
          else {
            local_100 = kcp->rx_rto;
          }
          _lost->rto = (int)local_100 / 2 + _lost->rto;
        }
        _lost->resendts = IVar1 + _lost->rto;
        seg.data[0] = '\x01';
        seg._65_3_ = 0;
      }
      if (bVar4) {
        _lost->ts = IVar1;
        _lost->wnd = seg.cmd;
        _lost->una = kcp->rcv_nxt;
        iVar6 = (int)_size - iVar5;
        if ((int)kcp->mtu < (int)(iVar6 + _lost->len + 0x18)) {
          ikcp_output(kcp,data,iVar6);
          _size = data;
        }
        _size = ikcp_encode_seg(_size,_lost);
        if (_lost->len != 0) {
          memcpy(_size,_lost->data,(ulong)_lost->len);
          _size = _size + _lost->len;
        }
        if (kcp->dead_link <= _lost->xmit) {
          kcp->state = 0xffffffff;
        }
      }
    }
    iVar5 = (int)_size - iVar5;
    if (0 < iVar5) {
      ikcp_output(kcp,data,iVar5);
    }
    if (seg._68_4_ != 0) {
      kcp->ssthresh = kcp->snd_nxt - kcp->snd_una >> 1;
      if (kcp->ssthresh < 2) {
        kcp->ssthresh = 2;
      }
      kcp->cwnd = kcp->ssthresh + local_f4;
      kcp->incr = kcp->cwnd * kcp->mss;
    }
    if (seg._64_4_ != 0) {
      kcp->ssthresh = p._4_4_ >> 1;
      if (kcp->ssthresh < 2) {
        kcp->ssthresh = 2;
      }
      kcp->cwnd = 1;
      kcp->incr = kcp->mss;
    }
    if (kcp->cwnd == 0) {
      kcp->cwnd = 1;
      kcp->incr = kcp->mss;
    }
  }
  return;
}

Assistant:

void ikcp_flush(ikcpcb *kcp)
{
	IUINT32 current = kcp->current;
	char *buffer = kcp->buffer;
	char *ptr = buffer;
	int count, size, i;
	IUINT32 resent, cwnd;
	IUINT32 rtomin;
	struct IQUEUEHEAD *p;
	int change = 0;
	int lost = 0;
	IKCPSEG seg;

	// 'ikcp_update' haven't been called. 
	if (kcp->updated == 0) return;

	seg.conv = kcp->conv;
	seg.cmd = IKCP_CMD_ACK;
	seg.frg = 0;
	seg.wnd = ikcp_wnd_unused(kcp);
	seg.una = kcp->rcv_nxt;
	seg.len = 0;
	seg.sn = 0;
	seg.ts = 0;

	// flush acknowledges
	count = kcp->ackcount;
	for (i = 0; i < count; i++) {
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ikcp_ack_get(kcp, i, &seg.sn, &seg.ts);
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	kcp->ackcount = 0;

	// probe window size (if remote window size equals zero)
	if (kcp->rmt_wnd == 0) {
		if (kcp->probe_wait == 0) {
			kcp->probe_wait = IKCP_PROBE_INIT;
			kcp->ts_probe = kcp->current + kcp->probe_wait;
		}	
		else {
			if (_itimediff(kcp->current, kcp->ts_probe) >= 0) {
				if (kcp->probe_wait < IKCP_PROBE_INIT) 
					kcp->probe_wait = IKCP_PROBE_INIT;
				kcp->probe_wait += kcp->probe_wait / 2;
				if (kcp->probe_wait > IKCP_PROBE_LIMIT)
					kcp->probe_wait = IKCP_PROBE_LIMIT;
				kcp->ts_probe = kcp->current + kcp->probe_wait;
				kcp->probe |= IKCP_ASK_SEND;
			}
		}
	}	else {
		kcp->ts_probe = 0;
		kcp->probe_wait = 0;
	}

	// flush window probing commands
	if (kcp->probe & IKCP_ASK_SEND) {
		seg.cmd = IKCP_CMD_WASK;
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	// flush window probing commands
	if (kcp->probe & IKCP_ASK_TELL) {
		seg.cmd = IKCP_CMD_WINS;
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	kcp->probe = 0;

	// calculate window size
	cwnd = _imin_(kcp->snd_wnd, kcp->rmt_wnd);
	if (kcp->nocwnd == 0) cwnd = _imin_(kcp->cwnd, cwnd);

	// move data from snd_queue to snd_buf
	while (_itimediff(kcp->snd_nxt, kcp->snd_una + cwnd) < 0) {
		IKCPSEG *newseg;
		if (iqueue_is_empty(&kcp->snd_queue)) break;

		newseg = iqueue_entry(kcp->snd_queue.next, IKCPSEG, node);

		iqueue_del(&newseg->node);
		iqueue_add_tail(&newseg->node, &kcp->snd_buf);
		kcp->nsnd_que--;
		kcp->nsnd_buf++;

		newseg->conv = kcp->conv;
		newseg->cmd = IKCP_CMD_PUSH;
		newseg->wnd = seg.wnd;
		newseg->ts = current;
		newseg->sn = kcp->snd_nxt++;
		newseg->una = kcp->rcv_nxt;
		newseg->resendts = current;
		newseg->rto = kcp->rx_rto;
		newseg->fastack = 0;
		newseg->xmit = 0;
	}

	// calculate resent
	resent = (kcp->fastresend > 0)? (IUINT32)kcp->fastresend : 0xffffffff;
	rtomin = (kcp->nodelay == 0)? (kcp->rx_rto >> 3) : 0;

	// flush data segments
	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = p->next) {
		IKCPSEG *segment = iqueue_entry(p, IKCPSEG, node);
		int needsend = 0;
		if (segment->xmit == 0) {
			needsend = 1;
			segment->xmit++;
			segment->rto = kcp->rx_rto;
			segment->resendts = current + segment->rto + rtomin;
		}
		else if (_itimediff(current, segment->resendts) >= 0) {
			needsend = 1;
			segment->xmit++;
			kcp->xmit++;
			if (kcp->nodelay == 0) {
				segment->rto += _imax_(segment->rto, (IUINT32)kcp->rx_rto);
			}	else {
				IINT32 step = (kcp->nodelay < 2)? 
					((IINT32)(segment->rto)) : kcp->rx_rto;
				segment->rto += step / 2;
			}
			segment->resendts = current + segment->rto;
			lost = 1;
		}
		else if (segment->fastack >= resent) {
			if ((int)segment->xmit <= kcp->fastlimit || 
				kcp->fastlimit <= 0) {
				needsend = 1;
				segment->xmit++;
				segment->fastack = 0;
				segment->resendts = current + segment->rto;
				change++;
			}
		}

		if (needsend) {
			int need;
			segment->ts = current;
			segment->wnd = seg.wnd;
			segment->una = kcp->rcv_nxt;

			size = (int)(ptr - buffer);
			need = IKCP_OVERHEAD + segment->len;

			if (size + need > (int)kcp->mtu) {
				ikcp_output(kcp, buffer, size);
				ptr = buffer;
			}

			ptr = ikcp_encode_seg(ptr, segment);

			if (segment->len > 0) {
				memcpy(ptr, segment->data, segment->len);
				ptr += segment->len;
			}

			if (segment->xmit >= kcp->dead_link) {
				kcp->state = (IUINT32)-1;
			}
		}
	}

	// flash remain segments
	size = (int)(ptr - buffer);
	if (size > 0) {
		ikcp_output(kcp, buffer, size);
	}

	// update ssthresh
	if (change) {
		IUINT32 inflight = kcp->snd_nxt - kcp->snd_una;
		kcp->ssthresh = inflight / 2;
		if (kcp->ssthresh < IKCP_THRESH_MIN)
			kcp->ssthresh = IKCP_THRESH_MIN;
		kcp->cwnd = kcp->ssthresh + resent;
		kcp->incr = kcp->cwnd * kcp->mss;
	}

	if (lost) {
		kcp->ssthresh = cwnd / 2;
		if (kcp->ssthresh < IKCP_THRESH_MIN)
			kcp->ssthresh = IKCP_THRESH_MIN;
		kcp->cwnd = 1;
		kcp->incr = kcp->mss;
	}

	if (kcp->cwnd < 1) {
		kcp->cwnd = 1;
		kcp->incr = kcp->mss;
	}
}